

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

unsigned_short Curl_sasl_decode_mech(char *ptr,size_t maxlen,size_t *len)

{
  char cVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    if ((int)lVar3 == 0x118) {
      return 0;
    }
    __n = *(size_t *)((long)transfer_unencoders + lVar3 + 8);
    if ((__n <= maxlen) &&
       (iVar2 = bcmp(ptr,*(void **)((long)transfer_unencoders + lVar3),__n), iVar2 == 0)) {
      if (len != (size_t *)0x0) {
        *len = __n;
      }
      if ((__n == maxlen) ||
         (((cVar1 = ptr[__n], (byte)(cVar1 - 0x3aU) < 0xf6 && (byte)(cVar1 + 0xa5U) < 0xe6 &&
           (cVar1 != '_')) && (cVar1 != '-')))) {
        return *(unsigned_short *)((long)&mechtable[0].name + lVar3);
      }
    }
    lVar3 = lVar3 + 0x18;
  } while( true );
}

Assistant:

unsigned short Curl_sasl_decode_mech(const char *ptr, size_t maxlen,
                                     size_t *len)
{
  unsigned int i;
  char c;

  for(i = 0; mechtable[i].name; i++) {
    if(maxlen >= mechtable[i].len &&
       !memcmp(ptr, mechtable[i].name, mechtable[i].len)) {
      if(len)
        *len = mechtable[i].len;

      if(maxlen == mechtable[i].len)
        return mechtable[i].bit;

      c = ptr[mechtable[i].len];
      if(!ISUPPER(c) && !ISDIGIT(c) && c != '-' && c != '_')
        return mechtable[i].bit;
    }
  }

  return 0;
}